

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

UniValue * __thiscall CRPCTable::dumpArgMap(CRPCTable *this,JSONRPCRequest *args_request)

{
  bool bVar1;
  reference commands;
  UniValue *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *values;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  *cmd;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  *__range1;
  UniValue *ret;
  const_iterator __end3;
  const_iterator __begin3;
  const_iterator __end1;
  const_iterator __begin1;
  UniValue result;
  JSONRPCRequest request;
  JSONRPCRequest *in_stack_fffffffffffffd28;
  JSONRPCRequest *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  UniValue *pUVar2;
  UniValue *this_00;
  reference in_stack_fffffffffffffd60;
  JSONRPCRequest *in_stack_fffffffffffffd68;
  JSONRPCRequest *in_stack_fffffffffffffd70;
  JSONRPCRequest *in_stack_fffffffffffffd78;
  UniValue local_180 [2];
  undefined4 local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar2 = in_RDI;
  JSONRPCRequest::JSONRPCRequest(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_88 = 2;
  this_00 = local_180;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::UniValue(in_RSI,(VType)((ulong)in_RDI >> 0x20),
                     (string *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
           *)in_stack_fffffffffffffd30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
         *)in_stack_fffffffffffffd30);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffd3f,
                                                   in_stack_fffffffffffffd38),
                                 (_Self *)in_stack_fffffffffffffd30), ((bVar1 ^ 0xffU) & 1) != 0) {
    commands = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                            *)in_stack_fffffffffffffd28);
    UniValue::UniValue((UniValue *)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd3f =
         ExecuteCommands((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                         commands,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    if ((bool)in_stack_fffffffffffffd3f) {
      in_stack_fffffffffffffd30 = (JSONRPCRequest *)UniValue::getValues(this_00);
      in_stack_fffffffffffffd68 = in_stack_fffffffffffffd30;
      std::vector<UniValue,_std::allocator<UniValue>_>::begin
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffd30);
      std::vector<UniValue,_std::allocator<UniValue>_>::end
                ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffd30);
      while (bVar1 = __gnu_cxx::
                     operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                                (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                 *)in_stack_fffffffffffffd30), ((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffd60 =
             __gnu_cxx::
             __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
             ::operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                          *)in_stack_fffffffffffffd28);
        UniValue::UniValue(this_00,pUVar2);
        UniValue::push_back(in_RDI,(UniValue *)
                                   CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffd28);
        __gnu_cxx::
        __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
        operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    *)in_stack_fffffffffffffd28);
      }
    }
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffd28);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                  *)in_stack_fffffffffffffd28);
  }
  JSONRPCRequest::~JSONRPCRequest(in_stack_fffffffffffffd28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CRPCTable::dumpArgMap(const JSONRPCRequest& args_request) const
{
    JSONRPCRequest request = args_request;
    request.mode = JSONRPCRequest::GET_ARGS;

    UniValue ret{UniValue::VARR};
    for (const auto& cmd : mapCommands) {
        UniValue result;
        if (ExecuteCommands(cmd.second, request, result)) {
            for (const auto& values : result.getValues()) {
                ret.push_back(values);
            }
        }
    }
    return ret;
}